

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate.cc
# Opt level: O0

float max_elem(float *arr,int length)

{
  int i;
  float max;
  int length_local;
  float *arr_local;
  
  max = *arr;
  for (i = 1; i < length; i = i + 1) {
    if (max < arr[i]) {
      max = arr[i];
    }
  }
  return max;
}

Assistant:

float max_elem(float* arr, int length)
{
  float max = arr[0];
  for (int i = 1; i < length; i++)
    if (arr[i] > max)
      max = arr[i];
  return max;
}